

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vsencoding.h
# Opt level: O1

void vsencoding::__vseblocks_unpack20(uint32_t *out,uint32_t *in,uint32_t bs)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  
  if (0x1f < bs + 0x1f) {
    uVar4 = bs + 0x1f >> 5;
    do {
      uVar1 = *in;
      *out = uVar1 >> 0xc;
      out[1] = (uVar1 & 0xfff) << 8;
      uVar2 = in[1];
      out[1] = (uVar1 & 0xfff) << 8 | uVar2 >> 0x18;
      out[2] = uVar2 >> 4 & 0xfffff;
      uVar1 = in[2];
      out[3] = (uVar2 & 0xf) << 0x10;
      out[3] = (uVar2 & 0xf) << 0x10 | uVar1 >> 0x10;
      out[4] = (uVar1 & 0xffff) << 4;
      uVar2 = in[3];
      out[4] = (uVar1 & 0xffff) << 4 | uVar2 >> 0x1c;
      out[5] = uVar2 >> 8 & 0xfffff;
      out[6] = (uVar2 & 0xff) << 0xc;
      uVar1 = in[4];
      out[6] = (uVar2 & 0xff) << 0xc | uVar1 >> 0x14;
      out[7] = uVar1 & 0xfffff;
      uVar1 = in[5];
      out[8] = uVar1 >> 0xc;
      out[9] = (uVar1 & 0xfff) << 8;
      uVar2 = in[6];
      out[9] = (uVar1 & 0xfff) << 8 | uVar2 >> 0x18;
      out[10] = uVar2 >> 4 & 0xfffff;
      out[0xb] = (uVar2 & 0xf) << 0x10;
      uVar1 = in[7];
      uVar3 = in[8];
      out[0xb] = (uVar2 & 0xf) << 0x10 | uVar1 >> 0x10;
      out[0xc] = (uVar1 & 0xffff) << 4;
      out[0xc] = (uVar1 & 0xffff) << 4 | uVar3 >> 0x1c;
      uVar1 = in[9];
      out[0xd] = uVar3 >> 8 & 0xfffff;
      out[0xe] = (uVar3 & 0xff) << 0xc;
      out[0xe] = (uVar3 & 0xff) << 0xc | uVar1 >> 0x14;
      out[0xf] = uVar1 & 0xfffff;
      uVar1 = in[10];
      out[0x10] = uVar1 >> 0xc;
      uVar2 = in[0xb];
      out[0x11] = (uVar1 & 0xfff) << 8;
      out[0x11] = (uVar1 & 0xfff) << 8 | uVar2 >> 0x18;
      out[0x12] = uVar2 >> 4 & 0xfffff;
      uVar1 = in[0xc];
      out[0x13] = (uVar2 & 0xf) << 0x10;
      out[0x13] = (uVar2 & 0xf) << 0x10 | uVar1 >> 0x10;
      uVar2 = in[0xd];
      out[0x14] = (uVar1 & 0xffff) << 4;
      out[0x14] = (uVar1 & 0xffff) << 4 | uVar2 >> 0x1c;
      out[0x15] = uVar2 >> 8 & 0xfffff;
      uVar1 = in[0xe];
      out[0x16] = (uVar2 & 0xff) << 0xc;
      out[0x16] = (uVar2 & 0xff) << 0xc | uVar1 >> 0x14;
      out[0x17] = uVar1 & 0xfffff;
      uVar1 = in[0xf];
      out[0x18] = uVar1 >> 0xc;
      out[0x19] = (uVar1 & 0xfff) << 8;
      uVar2 = in[0x10];
      out[0x19] = (uVar1 & 0xfff) << 8 | uVar2 >> 0x18;
      out[0x1a] = uVar2 >> 4 & 0xfffff;
      uVar1 = in[0x11];
      out[0x1b] = (uVar2 & 0xf) << 0x10;
      out[0x1b] = (uVar2 & 0xf) << 0x10 | uVar1 >> 0x10;
      out[0x1c] = (uVar1 & 0xffff) << 4;
      uVar2 = in[0x12];
      out[0x1c] = (uVar1 & 0xffff) << 4 | uVar2 >> 0x1c;
      out[0x1d] = uVar2 >> 8 & 0xfffff;
      out[0x1e] = (uVar2 & 0xff) << 0xc;
      uVar1 = in[0x13];
      out[0x1e] = (uVar2 & 0xff) << 0xc | uVar1 >> 0x14;
      out[0x1f] = uVar1 & 0xfffff;
      out = out + 0x20;
      in = in + 0x14;
      uVar4 = uVar4 - 1;
    } while (uVar4 != 0);
  }
  return;
}

Assistant:

void __vseblocks_unpack20(uint32_t *__restrict__ out,
                          const uint32_t *__restrict__ in, uint32_t bs) {
  for (bs = (bs + 31U) / 32U; bs > 0; out += 32, in += 20, --bs) {
    out[0] = in[0] >> 12;
    out[1] = (in[0] << 8) & 0x0fffff;
    out[1] |= in[1] >> 24;
    out[2] = (in[1] >> 4) & 0x0fffff;
    out[3] = (in[1] << 16) & 0x0fffff;
    out[3] |= in[2] >> 16;
    out[4] = (in[2] << 4) & 0x0fffff;
    out[4] |= in[3] >> 28;
    out[5] = (in[3] >> 8) & 0x0fffff;
    out[6] = (in[3] << 12) & 0x0fffff;
    out[6] |= in[4] >> 20;
    out[7] = in[4] & 0x0fffff;
    out[8] = in[5] >> 12;
    out[9] = (in[5] << 8) & 0x0fffff;
    out[9] |= in[6] >> 24;
    out[10] = (in[6] >> 4) & 0x0fffff;
    out[11] = (in[6] << 16) & 0x0fffff;
    out[11] |= in[7] >> 16;
    out[12] = (in[7] << 4) & 0x0fffff;
    out[12] |= in[8] >> 28;
    out[13] = (in[8] >> 8) & 0x0fffff;
    out[14] = (in[8] << 12) & 0x0fffff;
    out[14] |= in[9] >> 20;
    out[15] = in[9] & 0x0fffff;
    out[16] = in[10] >> 12;
    out[17] = (in[10] << 8) & 0x0fffff;
    out[17] |= in[11] >> 24;
    out[18] = (in[11] >> 4) & 0x0fffff;
    out[19] = (in[11] << 16) & 0x0fffff;
    out[19] |= in[12] >> 16;
    out[20] = (in[12] << 4) & 0x0fffff;
    out[20] |= in[13] >> 28;
    out[21] = (in[13] >> 8) & 0x0fffff;
    out[22] = (in[13] << 12) & 0x0fffff;
    out[22] |= in[14] >> 20;
    out[23] = in[14] & 0x0fffff;
    out[24] = in[15] >> 12;
    out[25] = (in[15] << 8) & 0x0fffff;
    out[25] |= in[16] >> 24;
    out[26] = (in[16] >> 4) & 0x0fffff;
    out[27] = (in[16] << 16) & 0x0fffff;
    out[27] |= in[17] >> 16;
    out[28] = (in[17] << 4) & 0x0fffff;
    out[28] |= in[18] >> 28;
    out[29] = (in[18] >> 8) & 0x0fffff;
    out[30] = (in[18] << 12) & 0x0fffff;
    out[30] |= in[19] >> 20;
    out[31] = in[19] & 0x0fffff;
  }
}